

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.h
# Opt level: O2

BLOCK_SIZE convert_length_to_bsize(int length)

{
  if (length == 4) {
    return BLOCK_4X4;
  }
  if (length == 8) {
    return BLOCK_8X8;
  }
  if (length != 0x10) {
    if (length == 0x40) {
      return BLOCK_64X64;
    }
    if (length == 0x20) {
      return BLOCK_32X32;
    }
  }
  return BLOCK_16X16;
}

Assistant:

static inline BLOCK_SIZE convert_length_to_bsize(int length) {
  switch (length) {
    case 64: return BLOCK_64X64;
    case 32: return BLOCK_32X32;
    case 16: return BLOCK_16X16;
    case 8: return BLOCK_8X8;
    case 4: return BLOCK_4X4;
    default:
      assert(0 && "Invalid block size for tpl model");
      return BLOCK_16X16;
  }
}